

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O2

string * __thiscall
BmsOutOfRangeAccessException::Message_abi_cxx11_
          (string *__return_storage_ptr__,BmsOutOfRangeAccessException *this)

{
  char *pcVar1;
  ostream *poVar2;
  stringstream os;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  pcVar1 = *(char **)((this->super_BmsWithCauseClassException).klass_ + 8);
  poVar2 = std::operator<<(local_188,pcVar1 + (*pcVar1 == '*'));
  std::operator<<(poVar2,"  - Tried to access over supporting range of BMS file format.");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string
BmsOutOfRangeAccessException::Message( void ) const
{
  std::stringstream os;
  os << this->GetCauseClass().name() << "  - Tried to access over supporting range of BMS file format.";
  return os.str();
}